

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string *config;
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  int iVar6;
  cmXcFrameworkPlistLibrary *args;
  LinkEntry *this_00;
  cmGeneratorTarget *this_01;
  cmListFileBacktrace *bt;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view suffix;
  string_view suffix_00;
  cmGeneratorTarget *tgt;
  allocator<char> local_1bd;
  ItemIsPath local_1bc;
  string xcFrameworkPath;
  cmGeneratorTarget *local_188;
  cmSourceFile *local_180;
  string local_178;
  LinkEntry libEntry;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_f0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_e0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_80;
  string local_50;
  
  this_01 = entry->Target;
  tgt = this_01;
  if (this_01 == (cmGeneratorTarget *)0x0) {
LAB_003b772e:
    str._M_str = (entry->Feature)._M_dataplus._M_p;
    str._M_len = (entry->Feature)._M_string_length;
    suffix._M_str = "FRAMEWORK";
    suffix._M_len = 9;
    bVar2 = cmHasSuffix(str,suffix);
    if (!bVar2) {
      _Var4 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
      if (((!_Var4) || (bVar2 = cmSystemTools::IsPathToFramework((string *)entry), !bVar2)) ||
         (bVar2 = cmGeneratorTarget::IsApple(this->Target), !bVar2)) {
        str_00._M_str = (entry->Feature)._M_dataplus._M_p;
        str_00._M_len = (entry->Feature)._M_string_length;
        suffix_00._M_str = "XCFRAMEWORK";
        suffix_00._M_len = 0xb;
        bVar2 = cmHasSuffix(str_00,suffix_00);
        if ((bVar2) ||
           (((_Var4 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_),
             _Var4 && (bVar2 = cmSystemTools::IsPathToXcFramework((string *)entry), bVar2)) &&
            (bVar2 = cmGeneratorTarget::IsApple(this->Target), bVar2)))) {
          AddXcFrameworkItem(this,entry);
          return;
        }
        bVar2 = cmsys::SystemTools::FileIsFullPath((string *)entry);
        if (bVar2) {
          bVar2 = cmsys::SystemTools::FileIsDirectory((string *)entry);
          if (!bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Depends,(value_type *)entry);
            AddFullItem(this,entry);
            AddLibraryRuntimeInfo(this,(string *)entry);
            return;
          }
          DropDirectoryItem(this,&entry->Item);
          return;
        }
        if (entry->Kind == Object) {
          return;
        }
        AddUserItem(this,entry,true);
        return;
      }
    }
    AddFrameworkItem(this,entry);
    return;
  }
  config = &this->Config;
  bVar2 = cmGeneratorTarget::IsExecutableWithExports(this_01);
  if (((bVar2) && (bVar3 = cmGeneratorTarget::HasImportLibrary(this_01,config), !bVar3)) &&
     ((this->LoaderFlag).Value == (string *)0x0)) {
    return;
  }
  bVar3 = cmGeneratorTarget::IsLinkable(this_01);
  if (!bVar3) goto LAB_003b772e;
  if (bVar2 && (this->LoaderFlag).Value != (string *)0x0) {
    bVar2 = cmGeneratorTarget::HasImportLibrary(this_01,config);
    cmGeneratorTarget::GetFullPath(&xcFrameworkPath,this_01,config,(uint)bVar2,true);
    std::__cxx11::string::string((string *)&local_a0,(string *)&xcFrameworkPath);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_e0,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&(entry->Item).Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&libEntry.Item,&local_a0,(cmListFileBacktrace *)&local_e0);
    local_180 = (cmSourceFile *)0x0;
    local_1bc = Yes;
    _Var4 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
    if (_Var4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"__CMAKE_LINK_EXECUTABLE",&local_1bd);
    }
    else {
      std::__cxx11::string::string((string *)&local_178,(string *)&entry->Feature);
    }
    local_188 = (cmGeneratorTarget *)FindLibraryFeature(this,&local_178);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&libEntry.Item,&local_1bc,&tgt,&local_180,(FeatureDescriptor **)&local_188);
    std::__cxx11::string::~string((string *)&local_178);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&libEntry.Item);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    std::__cxx11::string::~string((string *)&local_a0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Depends,
               &xcFrameworkPath);
LAB_003b79d8:
    this_00 = (LinkEntry *)&xcFrameworkPath;
  }
  else {
    TVar5 = cmGeneratorTarget::GetType(this_01);
    if (TVar5 == INTERFACE_LIBRARY) {
      libEntry.Item.Value._M_dataplus._M_p = (pointer)&libEntry.Item.Value.field_2;
      libEntry.Item.Value._M_string_length = 0;
      libEntry.Item.Value.field_2._M_local_buf[0] = '\0';
      xcFrameworkPath._M_dataplus._M_p._0_4_ = 0;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &libEntry,(ItemIsPath *)&xcFrameworkPath,&tgt);
      std::__cxx11::string::~string((string *)&libEntry);
      cmGeneratorTarget::GetImportedLibName(&xcFrameworkPath,tgt,config);
      if (xcFrameworkPath._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_c0,(string *)&xcFrameworkPath);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_f0,
                       (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)&(entry->Item).Backtrace);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_80,&local_c0,(cmListFileBacktrace *)&local_f0);
        cmComputeLinkDepends::LinkEntry::LinkEntry(&libEntry,&local_80,(cmGeneratorTarget *)0x0);
        AddItem(this,&libEntry);
        cmComputeLinkDepends::LinkEntry::~LinkEntry(&libEntry);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      goto LAB_003b79d8;
    }
    TVar5 = cmGeneratorTarget::GetType(this_01);
    if (TVar5 == OBJECT_LIBRARY) {
      libEntry.Item.Value._M_dataplus._M_p =
           libEntry.Item.Value._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&entry->Item,(ItemIsPath *)&libEntry,&tgt);
      goto LAB_003b79e2;
    }
    iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
    if ((char)iVar6 == '\0') {
LAB_003b7ba7:
      bVar2 = cmGeneratorTarget::HasImportLibrary(this_01,config);
      cmGeneratorTarget::GetFullPath(&local_50,tgt,config,(uint)bVar2,true);
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_d0,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)&(entry->Item).Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&xcFrameworkPath,&local_50,(cmListFileBacktrace *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = cmGeneratorTarget::IsAIX(tgt);
      if ((bVar3) &&
         (str_01._M_str._4_4_ = xcFrameworkPath._M_dataplus._M_p._4_4_,
         str_01._M_str._0_4_ = xcFrameworkPath._M_dataplus._M_p._0_4_,
         str_01._M_len = xcFrameworkPath._M_string_length,
         bVar3 = cmHasLiteralSuffix<10ul>(str_01,(char (*) [10])0x6c165a), bVar2 && bVar3)) {
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&xcFrameworkPath);
        return;
      }
      if ((this->LinkDependsNoShared != true) ||
         (TVar5 = cmGeneratorTarget::GetType(tgt), TVar5 != SHARED_LIBRARY)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,&xcFrameworkPath);
      }
      cmComputeLinkDepends::LinkEntry::LinkEntry(&libEntry,entry);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&libEntry.Item,
                (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&xcFrameworkPath);
      AddTargetItem(this,&libEntry);
      bVar2 = cmGeneratorTarget::IsApple(tgt);
      if ((bVar2) && (bVar2 = cmGeneratorTarget::HasImportLibrary(tgt,config), bVar2)) {
        cmGeneratorTarget::GetFullPath(&local_178,tgt,config,RuntimeBinaryArtifact,true);
        AddLibraryRuntimeInfo(this,&local_178,tgt);
        std::__cxx11::string::~string((string *)&local_178);
      }
      else {
        AddLibraryRuntimeInfo(this,&xcFrameworkPath,tgt);
      }
      if (((tgt != (cmGeneratorTarget *)0x0) &&
          (TVar5 = cmGeneratorTarget::GetType(tgt), TVar5 == SHARED_LIBRARY)) &&
         (bVar2 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar2)) {
        AddRuntimeDLL(this,tgt);
      }
      cmComputeLinkDepends::LinkEntry::~LinkEntry(&libEntry);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&xcFrameworkPath);
      goto LAB_003b79e2;
    }
    cmGeneratorTarget::GetImportedXcFrameworkPath((string *)&libEntry,this_01,config);
    sVar1 = libEntry.Item.Value._M_string_length;
    std::__cxx11::string::~string((string *)&libEntry);
    this_01 = tgt;
    if (sVar1 == 0) goto LAB_003b7ba7;
    cmGeneratorTarget::GetImportedXcFrameworkPath((string *)&libEntry,tgt,config);
    local_178._M_dataplus._M_p = (pointer)0x0;
    local_188 = (cmGeneratorTarget *)CONCAT44(local_188._4_4_,1);
    _Var4 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
    if (_Var4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&xcFrameworkPath,"__CMAKE_LINK_XCFRAMEWORK",(allocator<char> *)&local_1bc
                );
    }
    else {
      std::__cxx11::string::string((string *)&xcFrameworkPath,(string *)&entry->Feature);
    }
    local_180 = (cmSourceFile *)FindLibraryFeature(this,&xcFrameworkPath);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &libEntry,(ItemIsPath *)&local_188,&tgt,(void **)&local_178,
               (FeatureDescriptor **)&local_180);
    std::__cxx11::string::~string((string *)&xcFrameworkPath);
    this_00 = &libEntry;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_003b79e2:
  cmGeneratorTarget::GetImportedXcFrameworkPath(&xcFrameworkPath,tgt,config);
  if (xcFrameworkPath._M_string_length != 0) {
    bt = &(entry->Item).Backtrace;
    cmParseXcFrameworkPlist
              ((optional<cmXcFrameworkPlist> *)&libEntry,&xcFrameworkPath,this->Makefile,bt);
    if ((((char)libEntry.ObjectSource != '\0') &&
        (args = cmXcFrameworkPlist::SelectSuitableLibrary
                          ((cmXcFrameworkPlist *)&libEntry,this->Makefile,bt),
        args != (cmXcFrameworkPlistLibrary *)0x0)) && ((args->HeadersPath)._M_string_length != 0)) {
      local_180 = (cmSourceFile *)CONCAT71(local_180._1_7_,0x2f);
      local_188 = (cmGeneratorTarget *)CONCAT71(local_188._1_7_,0x2f);
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_178,&xcFrameworkPath,(char *)&local_180,&args->LibraryIdentifier,
                 (char *)&local_188,&args->HeadersPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->XcFrameworkHeaderPaths,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::_Optional_payload_base<cmXcFrameworkPlist>::_M_reset
              ((_Optional_payload_base<cmXcFrameworkPlist> *)&libEntry);
  }
  std::__cxx11::string::~string((string *)&xcFrameworkPath);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      this->Items.emplace_back(item, ItemIsPath::No, tgt);
    } else if (this->GlobalGenerator->IsXcode() &&
               !tgt->GetImportedXcFrameworkPath(config).empty()) {
      this->Items.emplace_back(
        tgt->GetImportedXcFrameworkPath(config), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      if (tgt->IsApple() && tgt->HasImportLibrary(config)) {
        // Use the library rather than the tbd file for runpath computation
        this->AddLibraryRuntimeInfo(
          tgt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact, true),
          tgt);
      } else {
        this->AddLibraryRuntimeInfo(lib.Value, tgt);
      }
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }

    auto xcFrameworkPath = tgt->GetImportedXcFrameworkPath(config);
    if (!xcFrameworkPath.empty()) {
      auto plist = cmParseXcFrameworkPlist(xcFrameworkPath, *this->Makefile,
                                           item.Backtrace);
      if (!plist) {
        return;
      }
      if (auto const* library =
            plist->SelectSuitableLibrary(*this->Makefile, item.Backtrace)) {
        if (!library->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(xcFrameworkPath, '/',
                                                  library->LibraryIdentifier,
                                                  '/', library->HeadersPath));
        }
      } else {
        return;
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Target->IsApple())) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmHasSuffix(entry.Feature, "XCFRAMEWORK"_s) ||
               (entry.Feature == DEFAULT &&
                cmSystemTools::IsPathToXcFramework(item.Value) &&
                this->Target->IsApple())) {
      // This is a framework.
      this->AddXcFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else if (entry.Kind != cmComputeLinkDepends::LinkEntry::Object) {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}